

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::MergePartialFromCodedStream
          (VisionFeaturePrint_Objects *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  Arena *this_01;
  char *data;
  bool bVar5;
  uint uVar6;
  uint32 uVar7;
  string *value;
  Type *pTVar8;
  int iVar9;
  ulong uVar10;
  Rep *pRVar11;
  
  this_00 = &this->output_;
LAB_003be86d:
  do {
    pbVar4 = input->buffer_;
    uVar7 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar2 = *pbVar4;
      uVar10 = (ulong)bVar2;
      pbVar1 = pbVar4 + 1;
      uVar6 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar6, (~(uint)*pbVar1 & uVar6) < 0x80))
        goto LAB_003bea4b;
        uVar10 = (ulong)((uVar6 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar10 = uVar10 | 0x100000000;
    }
    else {
LAB_003bea4b:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar10 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar7 | uVar10;
    }
    uVar7 = (uint32)uVar10;
    if ((uVar10 & 0x100000000) == 0) {
LAB_003be92d:
      if (uVar7 == 0) {
        return true;
      }
      if ((uVar7 & 7) == 4) {
        return true;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
      if (!bVar5) {
        return false;
      }
      goto LAB_003be86d;
    }
    uVar6 = (uint)(uVar10 >> 3) & 0x1fffffff;
    if (uVar6 == 100) {
      if ((char)uVar10 != '\"') goto LAB_003be92d;
      pRVar11 = (this->output_).super_RepeatedPtrFieldBase.rep_;
      if (pRVar11 == (Rep *)0x0) {
        iVar9 = (this->output_).super_RepeatedPtrFieldBase.total_size_;
LAB_003be967:
        google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                  (&this_00->super_RepeatedPtrFieldBase,iVar9 + 1);
        pRVar11 = (this->output_).super_RepeatedPtrFieldBase.rep_;
        iVar9 = pRVar11->allocated_size;
LAB_003be978:
        pRVar11->allocated_size = iVar9 + 1;
        this_01 = (this_00->super_RepeatedPtrFieldBase).arena_;
        if (this_01 == (Arena *)0x0) {
          value = (string *)operator_new(0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
        }
        else {
          value = (string *)
                  google::protobuf::Arena::AllocateAligned
                            (this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          (value->_M_dataplus)._M_p = (pointer)&value->field_2;
          value->_M_string_length = 0;
          (value->field_2)._M_local_buf[0] = '\0';
          google::protobuf::Arena::AddListNode
                    (this_01,value,
                     google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
          pRVar11 = (this->output_).super_RepeatedPtrFieldBase.rep_;
        }
        iVar9 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
        (this->output_).super_RepeatedPtrFieldBase.current_size_ = iVar9 + 1;
        pRVar11->elements[iVar9] = value;
      }
      else {
        iVar3 = (this->output_).super_RepeatedPtrFieldBase.current_size_;
        iVar9 = pRVar11->allocated_size;
        if (iVar9 <= iVar3) {
          if (iVar9 == (this->output_).super_RepeatedPtrFieldBase.total_size_) goto LAB_003be967;
          goto LAB_003be978;
        }
        (this->output_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        value = (string *)pRVar11->elements[iVar3];
      }
      bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
      if (!bVar5) {
        return false;
      }
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,
                          (this->output_).super_RepeatedPtrFieldBase.current_size_ + -1);
      data = (pTVar8->_M_dataplus)._M_p;
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,
                          (this->output_).super_RepeatedPtrFieldBase.current_size_ + -1);
      bVar5 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        (data,(int)pTVar8->_M_string_length,PARSE,
                         "CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output");
      if (!bVar5) {
        return false;
      }
    }
    else {
      if ((uVar6 != 1) || ((char)uVar10 != '\b')) goto LAB_003be92d;
      pbVar4 = input->buffer_;
      if (pbVar4 < input->buffer_end_) {
        bVar2 = *pbVar4;
        uVar10 = (ulong)bVar2;
        uVar7 = (uint32)bVar2;
        if ((char)bVar2 < '\0') goto LAB_003bea71;
        input->buffer_ = pbVar4 + 1;
      }
      else {
        uVar7 = 0;
LAB_003bea71:
        uVar10 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
        if ((long)uVar10 < 0) {
          return false;
        }
      }
      this->version_ = (int)uVar10;
    }
  } while( true );
}

Assistant:

bool VisionFeaturePrint_Objects::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.ObjectsVersion version = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_version(static_cast< ::CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string output = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_output()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->output(this->output_size() - 1).data(),
            this->output(this->output_size() - 1).length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.output"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  return false;
#undef DO_
}